

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_model_animation_array
rf_load_model_animations_from_iqm
          (uchar *data,int data_size,rf_allocator allocator,rf_allocator temp_allocator)

{
  void *pvVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  long lVar15;
  long lVar16;
  rf_source_location rVar17;
  rf_source_location rVar18;
  rf_source_location rVar19;
  rf_source_location rVar20;
  rf_source_location rVar21;
  rf_source_location rVar22;
  rf_source_location rVar23;
  rf_source_location rVar24;
  rf_source_location rVar25;
  rf_source_location rVar26;
  rf_allocator_args rVar27;
  rf_allocator_args rVar28;
  rf_allocator_args rVar29;
  undefined1 auVar30 [24];
  undefined1 auVar31 [24];
  undefined1 auVar32 [24];
  undefined1 auVar33 [24];
  undefined1 auVar34 [24];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  rf_model_animation *prVar37;
  void *__dest;
  void *__dest_00;
  rf_bone_info *prVar38;
  rf_transform **pprVar39;
  int *piVar40;
  rf_transform *prVar41;
  long lVar42;
  int iVar43;
  ulong uVar44;
  float *pfVar45;
  rf_model_animation *prVar46;
  ulong uVar47;
  undefined8 uVar48;
  size_t sVar49;
  long lVar50;
  long in_FS_OFFSET;
  float fVar51;
  undefined1 auVar52 [16];
  float qax;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  rf_model_animation_array rVar57;
  rf_quaternion q;
  rf_vec3 rVar58;
  rf_iqm_header iqm;
  rf_allocator local_390;
  int *local_380;
  int local_374;
  rf_model_animation *local_370;
  ulong local_368;
  void *local_360;
  rf_allocator local_358;
  long local_348;
  undefined8 uStack_340;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  float *local_318;
  rf_model_animation *local_310;
  void *local_308;
  undefined8 uStack_300;
  undefined4 local_2f8;
  uint uStack_2f4;
  char *local_2f0;
  char *pcStack_2e8;
  undefined8 local_2e0;
  int *local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2c8;
  uint uStack_2c4;
  char *local_2c0;
  char *pcStack_2b8;
  undefined8 local_2b0;
  void *local_2a8;
  undefined8 uStack_2a0;
  undefined4 local_298;
  uint uStack_294;
  char *local_290;
  char *pcStack_288;
  undefined8 local_280;
  undefined8 local_278;
  long lStack_270;
  undefined4 local_268;
  uint uStack_264;
  char *local_260;
  char *pcStack_258;
  undefined8 local_250;
  undefined8 local_248;
  long lStack_240;
  undefined4 local_238;
  uint uStack_234;
  char *local_230;
  char *pcStack_228;
  undefined8 local_220;
  undefined8 local_218;
  long lStack_210;
  undefined4 local_208;
  uint uStack_204;
  char *local_200;
  char *pcStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  size_t sStack_1e0;
  undefined4 local_1d8;
  uint uStack_1d4;
  char *local_1d0;
  char *pcStack_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  long lStack_1b0;
  undefined4 local_1a8;
  uint uStack_1a4;
  char *local_1a0;
  char *pcStack_198;
  undefined8 local_190;
  undefined8 local_188;
  size_t sStack_180;
  undefined4 local_178;
  uint uStack_174;
  char *local_170;
  char *pcStack_168;
  undefined8 local_160;
  undefined8 local_158;
  size_t sStack_150;
  undefined4 local_148;
  uint uStack_144;
  char *local_140;
  char *pcStack_138;
  undefined8 local_130;
  char *local_128;
  char *pcStack_120;
  undefined8 local_118;
  char *local_110;
  char *pcStack_108;
  undefined8 local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char local_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char cStack_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  int local_b4;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  local_358.user_data = temp_allocator.user_data;
  local_390.allocator_proc = allocator.allocator_proc;
  local_390.user_data = allocator.user_data;
  uVar44 = 0;
  local_370 = (rf_model_animation *)0x0;
  if (data_size != 0 && data != (uchar *)0x0) {
    local_358.allocator_proc = temp_allocator.allocator_proc;
    memcpy(&local_c4,data,0x7c);
    auVar52[0] = -(local_c4 == 'I');
    auVar52[1] = -(cStack_c3 == 'N');
    auVar52[2] = -(cStack_c2 == 'T');
    auVar52[3] = -(cStack_c1 == 'E');
    auVar52[4] = -(cStack_c0 == 'R');
    auVar52[5] = -(cStack_bf == 'Q');
    auVar52[6] = -(cStack_be == 'U');
    auVar52[7] = -(cStack_bd == 'A');
    auVar52[8] = -(cStack_bc == 'K');
    auVar52[9] = -(cStack_bb == 'E');
    auVar52[10] = -(cStack_ba == 'M');
    auVar52[0xb] = -(cStack_b9 == 'O');
    auVar52[0xc] = -(cStack_b8 == 'D');
    auVar52[0xd] = -(cStack_b7 == 'E');
    auVar52[0xe] = -(cStack_b6 == 'L');
    auVar52[0xf] = -(cStack_b5 == '\0');
    if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf
                ) == 0xffff) {
      if (local_b4 == 2) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_138 = "rf_load_model_animations_from_iqm";
        local_130 = 0x8670;
        local_158 = 0;
        local_328 = (ulong)local_78;
        sVar49 = local_328 * 0x58;
        local_148 = 0;
        rVar17.proc_name = "rf_load_model_animations_from_iqm";
        rVar17.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar17.line_in_file = 0x8670;
        auVar30._8_8_ = (ulong)uStack_144 << 0x20;
        auVar30._0_8_ = sVar49;
        auVar30._16_8_ = 0;
        sStack_150 = sVar49;
        local_380 = (int *)(*temp_allocator.allocator_proc)
                                     (&local_358,rVar17,RF_AM_ALLOC,
                                      (rf_allocator_args)(auVar30 << 0x40));
        memcpy(local_380,data + local_74,sVar49);
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_168 = "rf_load_model_animations_from_iqm";
        local_160 = 0x8674;
        local_188 = 0;
        uVar44 = (ulong)local_70;
        sVar49 = uVar44 * 0x14;
        local_178 = 0;
        rVar18.proc_name = "rf_load_model_animations_from_iqm";
        rVar18.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar18.line_in_file = 0x8674;
        auVar31._8_8_ = (ulong)uStack_174 << 0x20;
        auVar31._0_8_ = sVar49;
        auVar31._16_8_ = 0;
        sStack_180 = sVar49;
        __dest = (*local_358.allocator_proc)
                           (&local_358,rVar18,RF_AM_ALLOC,(rf_allocator_args)(auVar31 << 0x40));
        memcpy(__dest,data + local_6c,sVar49);
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_198 = "rf_load_model_animations_from_iqm";
        local_190 = 0x8677;
        local_1b8 = 0;
        lStack_1b0 = uVar44 << 5;
        local_1a8 = 0;
        rVar19.proc_name = "rf_load_model_animations_from_iqm";
        rVar19.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar19.line_in_file = 0x8677;
        auVar32._8_8_ = (ulong)uStack_1a4 << 0x20;
        auVar32._0_8_ = lStack_1b0;
        auVar32._16_8_ = 0;
        local_370 = (rf_model_animation *)
                    (*local_390.allocator_proc)
                              (&local_390,rVar19,RF_AM_ALLOC,(rf_allocator_args)(auVar32 << 0x40));
        local_1d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_1c8 = "rf_load_model_animations_from_iqm";
        local_1c0 = 0x867d;
        local_1e8 = 0;
        local_374 = local_64;
        sVar49 = (ulong)(uint)(local_68 * local_64) * 2;
        local_1d8 = 0;
        rVar20.proc_name = "rf_load_model_animations_from_iqm";
        rVar20.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar20.line_in_file = 0x867d;
        auVar33._8_8_ = (ulong)uStack_1d4 << 0x20;
        auVar33._0_8_ = sVar49;
        auVar33._16_8_ = 0;
        sStack_1e0 = sVar49;
        __dest_00 = (*local_358.allocator_proc)
                              (&local_358,rVar20,RF_AM_ALLOC,(rf_allocator_args)(auVar33 << 0x40));
        memcpy(__dest_00,data + local_60,sVar49);
        if (uVar44 != 0) {
          local_368 = (ulong)local_78;
          lVar16 = local_368 * 0x28;
          local_318 = (float *)(local_380 + 0x15);
          uVar47 = 0;
          local_330 = uVar44;
          do {
            prVar37 = local_370;
            local_348 = uVar47 * 5;
            prVar46 = local_370 + uVar47;
            local_370[uVar47].frame_count = (ulong)*(uint *)((long)__dest + uVar47 * 0x14 + 8);
            local_370[uVar47].bone_count = local_328;
            local_200 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_1f8 = "rf_load_model_animations_from_iqm";
            local_1f0 = 0x8684;
            local_218 = 0;
            local_208 = 0;
            rVar21.proc_name = "rf_load_model_animations_from_iqm";
            rVar21.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar21.line_in_file = 0x8684;
            auVar34._8_8_ = (ulong)uStack_204 << 0x20;
            auVar34._0_8_ = lVar16;
            auVar34._16_8_ = 0;
            local_320 = uVar47;
            lStack_210 = lVar16;
            prVar38 = (rf_bone_info *)
                      (*local_390.allocator_proc)
                                (&local_390,rVar21,RF_AM_ALLOC,(rf_allocator_args)(auVar34 << 0x40))
            ;
            lVar50 = local_348;
            prVar37[uVar47].bones = prVar38;
            local_230 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_228 = "rf_load_model_animations_from_iqm";
            local_220 = 0x8685;
            local_248 = 0;
            lStack_240 = (ulong)*(uint *)((long)__dest + local_348 * 4 + 8) << 3;
            local_238 = 0;
            rVar22.proc_name = "rf_load_model_animations_from_iqm";
            rVar22.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar22.line_in_file = 0x8685;
            auVar35._8_8_ = (ulong)uStack_234 << 0x20;
            auVar35._0_8_ = lStack_240;
            auVar35._16_8_ = 0;
            pprVar39 = (rf_transform **)
                       (*local_390.allocator_proc)
                                 (&local_390,rVar22,RF_AM_ALLOC,(rf_allocator_args)(auVar35 << 0x40)
                                 );
            prVar37[uVar47].frame_poses = pprVar39;
            if ((int)local_368 != 0) {
              lVar42 = 0;
              piVar40 = local_380;
              do {
                builtin_strncpy(prVar46->bones->name + lVar42,"ANIMJOINTNAME",0xe);
                *(long *)(prVar46->bones->name + lVar42 + 0x20) = (long)*piVar40;
                lVar42 = lVar42 + 0x28;
                piVar40 = piVar40 + 0x16;
              } while (lVar16 != lVar42);
            }
            pvVar1 = (void *)((long)__dest + lVar50 * 4);
            if (*(int *)((long)pvVar1 + 8) != 0) {
              uVar44 = 0;
              do {
                local_260 = 
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                ;
                pcStack_258 = "rf_load_model_animations_from_iqm";
                local_250 = 0x8690;
                local_278 = 0;
                local_268 = 0;
                rVar23.proc_name = "rf_load_model_animations_from_iqm";
                rVar23.file_name =
                     "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                ;
                rVar23.line_in_file = 0x8690;
                auVar36._8_8_ = (ulong)uStack_264 << 0x20;
                auVar36._0_8_ = lVar16;
                auVar36._16_8_ = 0;
                lStack_270 = lVar16;
                prVar41 = (rf_transform *)
                          (*local_390.allocator_proc)
                                    (&local_390,rVar23,RF_AM_ALLOC,
                                     (rf_allocator_args)(auVar36 << 0x40));
                prVar46->frame_poses[uVar44] = prVar41;
                uVar44 = uVar44 + 1;
              } while (uVar44 < *(uint *)((long)pvVar1 + 8));
            }
            local_360 = pvVar1;
            if (*(int *)((long)pvVar1 + 8) != 0) {
              iVar43 = *(int *)((long)pvVar1 + 4) * local_374;
              uVar44 = 0;
              local_310 = prVar46;
              do {
                if ((int)local_368 != 0) {
                  lVar50 = 0;
                  pfVar45 = local_318;
                  do {
                    fVar53 = pfVar45[-0x13];
                    prVar41 = prVar46->frame_poses[uVar44];
                    *(float *)((long)&(prVar41->translation).x + lVar50) = fVar53;
                    fVar54 = pfVar45[-0x14];
                    if (((uint)fVar54 & 1) != 0) {
                      *(float *)((long)&(prVar41->translation).x + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-9] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0x12];
                    *(float *)((long)&(prVar41->translation).y + lVar50) = fVar53;
                    if (((uint)fVar54 & 2) != 0) {
                      *(float *)((long)&(prVar41->translation).y + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-8] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0x11];
                    *(float *)((long)&(prVar41->translation).z + lVar50) = fVar53;
                    if (((uint)fVar54 & 4) != 0) {
                      *(float *)((long)&(prVar41->translation).z + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-7] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0x10];
                    *(float *)((long)&(prVar41->rotation).x + lVar50) = fVar53;
                    if (((uint)fVar54 & 8) != 0) {
                      *(float *)((long)&(prVar41->rotation).x + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-6] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0xf];
                    *(float *)((long)&(prVar41->rotation).y + lVar50) = fVar53;
                    if (((uint)fVar54 & 0x10) != 0) {
                      *(float *)((long)&(prVar41->rotation).y + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-5] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0xe];
                    *(float *)((long)&(prVar41->rotation).z + lVar50) = fVar53;
                    if (((uint)fVar54 & 0x20) != 0) {
                      *(float *)((long)&(prVar41->rotation).z + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-4] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0xd];
                    *(float *)((long)&(prVar41->rotation).w + lVar50) = fVar53;
                    if (((uint)fVar54 & 0x40) != 0) {
                      *(float *)((long)&(prVar41->rotation).w + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-3] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0xc];
                    *(float *)((long)&(prVar41->scale).x + lVar50) = fVar53;
                    if (SUB41(fVar54,0) < '\0') {
                      *(float *)((long)&(prVar41->scale).x + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-2] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-0xb];
                    *(float *)((long)&(prVar41->scale).y + lVar50) = fVar53;
                    if (((uint)fVar54 >> 8 & 1) != 0) {
                      *(float *)((long)&(prVar41->scale).y + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * pfVar45[-1] +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    fVar53 = pfVar45[-10];
                    *(float *)((long)&(prVar41->scale).z + lVar50) = fVar53;
                    if (((uint)fVar54 >> 9 & 1) != 0) {
                      *(float *)((long)&(prVar41->scale).z + lVar50) =
                           (float)*(ushort *)((long)__dest_00 + (long)iVar43 * 2) * *pfVar45 +
                           fVar53;
                      iVar43 = iVar43 + 1;
                    }
                    lVar42 = *(long *)((long)&(prVar41->rotation).x + lVar50);
                    fVar53 = (float)lVar42;
                    fVar55 = (float)((ulong)lVar42 >> 0x20);
                    uVar48 = *(undefined8 *)((long)&(prVar41->rotation).z + lVar50);
                    fVar54 = (float)uVar48;
                    fVar56 = (float)((ulong)uVar48 >> 0x20);
                    fVar51 = fVar56 * fVar56 + fVar54 * fVar54 + fVar53 * fVar53 + fVar55 * fVar55;
                    if (fVar51 < 0.0) {
                      uStack_340 = 0;
                      uStack_d0 = 0;
                      local_348 = lVar42;
                      local_f8 = fVar56;
                      fStack_f4 = fVar56;
                      fStack_f0 = fVar56;
                      fStack_ec = fVar56;
                      local_e8 = fVar55;
                      fStack_e4 = fVar55;
                      fStack_e0 = fVar55;
                      fStack_dc = fVar55;
                      local_d8 = uVar48;
                      fVar51 = sqrtf(fVar51);
                      prVar46 = local_310;
                      fVar53 = (float)local_348;
                      fVar54 = (float)local_d8;
                      fVar55 = local_e8;
                      fVar56 = local_f8;
                    }
                    else {
                      fVar51 = SQRT(fVar51);
                    }
                    fVar51 = (float)(-(uint)(fVar51 == 0.0) & 0x3f800000 |
                                    ~-(uint)(fVar51 == 0.0) & (uint)(1.0 / fVar51));
                    pfVar2 = (float *)((long)&(prVar41->rotation).x + lVar50);
                    *pfVar2 = fVar53 * fVar51;
                    pfVar2[1] = fVar55 * fVar51;
                    pfVar2[2] = fVar54 * fVar51;
                    pfVar2[3] = fVar51 * fVar56;
                    lVar50 = lVar50 + 0x28;
                    pfVar45 = pfVar45 + 0x16;
                  } while (lVar16 != lVar50);
                }
                uVar44 = uVar44 + 1;
              } while (uVar44 < *(uint *)((long)local_360 + 8));
            }
            if (*(int *)((long)local_360 + 8) != 0) {
              uVar44 = 0;
              do {
                if (0 < prVar46->bone_count) {
                  lVar50 = 0;
                  lVar42 = 0;
                  do {
                    lVar15 = *(long *)(prVar46->bones->name + lVar50 + 0x20);
                    if (-1 < lVar15) {
                      prVar41 = prVar46->frame_poses[uVar44];
                      uVar3 = prVar41[lVar15].rotation.x;
                      uVar9 = prVar41[lVar15].rotation.y;
                      uVar4 = prVar41[lVar15].rotation.z;
                      uVar10 = prVar41[lVar15].rotation.w;
                      uVar48 = *(undefined8 *)((long)&(prVar41->rotation).x + lVar50);
                      fVar53 = (float)uVar48;
                      fVar54 = (float)((ulong)uVar48 >> 0x20);
                      uVar48 = *(undefined8 *)((long)&(prVar41->rotation).z + lVar50);
                      fVar55 = (float)uVar48;
                      fVar56 = (float)((ulong)uVar48 >> 0x20);
                      *(ulong *)((long)&(prVar41->rotation).x + lVar50) =
                           CONCAT44(((float)uVar4 * fVar53 +
                                    (float)uVar9 * fVar56 + (float)uVar10 * fVar54) -
                                    (float)uVar3 * fVar55,
                                    ((float)uVar9 * fVar55 +
                                    (float)uVar3 * fVar56 + (float)uVar10 * fVar53) -
                                    (float)uVar4 * fVar54);
                      *(ulong *)((long)&(prVar41->rotation).z + lVar50) =
                           CONCAT44(((fVar56 * (float)uVar10 - fVar53 * (float)uVar3) -
                                    fVar54 * (float)uVar9) - (float)uVar4 * fVar55,
                                    ((float)uVar3 * fVar54 +
                                    (float)uVar4 * fVar56 + (float)uVar10 * fVar55) -
                                    (float)uVar9 * fVar53);
                      prVar41 = prVar46->frame_poses[uVar44];
                      lVar15 = *(long *)(prVar46->bones->name + lVar50 + 0x20);
                      uVar5 = prVar41[lVar15].rotation.x;
                      uVar11 = prVar41[lVar15].rotation.y;
                      q.y = (float)uVar11;
                      q.x = (float)uVar5;
                      uVar6 = prVar41[lVar15].rotation.z;
                      uVar12 = prVar41[lVar15].rotation.w;
                      q.w = (float)uVar12;
                      q.z = (float)uVar6;
                      rVar58.z = *(float *)((long)&(prVar41->translation).z + lVar50);
                      rVar58._0_8_ = *(undefined8 *)((long)&(prVar41->translation).x + lVar50);
                      rVar58 = rf_vec3_rotate_by_quaternion(rVar58,q);
                      *(long *)((long)&(prVar41->translation).x + lVar50) = rVar58._0_8_;
                      *(float *)((long)&(prVar41->translation).z + lVar50) = rVar58.z;
                      prVar41 = prVar46->frame_poses[uVar44];
                      lVar15 = *(long *)(prVar46->bones->name + lVar50 + 0x20);
                      uVar48 = *(undefined8 *)((long)&(prVar41->translation).x + lVar50);
                      uVar7 = prVar41[lVar15].translation.x;
                      uVar13 = prVar41[lVar15].translation.y;
                      fVar53 = prVar41[lVar15].translation.z;
                      *(ulong *)((long)&(prVar41->translation).x + lVar50) =
                           CONCAT44((float)uVar13 + (float)((ulong)uVar48 >> 0x20),
                                    (float)uVar7 + (float)uVar48);
                      *(float *)((long)&(prVar41->translation).z + lVar50) =
                           *(float *)((long)&(prVar41->translation).z + lVar50) + fVar53;
                      prVar41 = prVar46->frame_poses[uVar44];
                      lVar15 = *(long *)(prVar46->bones->name + lVar50 + 0x20);
                      uVar48 = *(undefined8 *)((long)&(prVar41->scale).x + lVar50);
                      uVar8 = prVar41[lVar15].scale.x;
                      uVar14 = prVar41[lVar15].scale.y;
                      fVar53 = prVar41[lVar15].scale.z;
                      *(ulong *)((long)&(prVar41->scale).x + lVar50) =
                           CONCAT44((float)uVar14 * (float)((ulong)uVar48 >> 0x20),
                                    (float)uVar8 * (float)uVar48);
                      *(float *)((long)&(prVar41->scale).z + lVar50) =
                           *(float *)((long)&(prVar41->scale).z + lVar50) * fVar53;
                    }
                    lVar42 = lVar42 + 1;
                    lVar50 = lVar50 + 0x28;
                  } while (lVar42 < prVar46->bone_count);
                }
                uVar44 = uVar44 + 1;
              } while (uVar44 < *(uint *)((long)local_360 + 8));
            }
            uVar47 = local_320 + 1;
            uVar44 = local_330;
          } while (uVar47 != local_330);
        }
        local_290 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_288 = "rf_load_model_animations_from_iqm";
        local_280 = 0x86fd;
        uStack_2a0 = 0;
        local_298 = 0;
        rVar24.proc_name = "rf_load_model_animations_from_iqm";
        rVar24.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar24.line_in_file = 0x86fd;
        rVar27.size_to_allocate_or_reallocate = 0;
        rVar27.pointer_to_free_or_realloc = __dest_00;
        rVar27._16_8_ = (ulong)uStack_294 << 0x20;
        local_2a8 = __dest_00;
        (*local_358.allocator_proc)(&local_358,rVar24,RF_AM_FREE,rVar27);
        local_2c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_2b8 = "rf_load_model_animations_from_iqm";
        local_2b0 = 0x86fe;
        local_2d8 = local_380;
        uStack_2d0 = 0;
        local_2c8 = 0;
        rVar25.proc_name = "rf_load_model_animations_from_iqm";
        rVar25.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar25.line_in_file = 0x86fe;
        rVar28.size_to_allocate_or_reallocate = 0;
        rVar28.pointer_to_free_or_realloc = local_380;
        rVar28._16_8_ = (ulong)uStack_2c4 << 0x20;
        (*local_358.allocator_proc)(&local_358,rVar25,RF_AM_FREE,rVar28);
        local_2f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_2e8 = "rf_load_model_animations_from_iqm";
        local_2e0 = 0x86ff;
        uStack_300 = 0;
        local_2f8 = 0;
        rVar26.proc_name = "rf_load_model_animations_from_iqm";
        rVar26.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar26.line_in_file = 0x86ff;
        rVar29.size_to_allocate_or_reallocate = 0;
        rVar29.pointer_to_free_or_realloc = __dest;
        rVar29._16_8_ = (ulong)uStack_2f4 << 0x20;
        local_308 = __dest;
        (*local_358.allocator_proc)(&local_358,rVar26,RF_AM_FREE,rVar29);
        goto LAB_0014283f;
      }
      local_128 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_120 = "rf_load_model_animations_from_iqm";
      uVar48 = 0x8666;
      local_118 = 0x8666;
      rf_log_impl(8,0x17da0c,(char *)0x5);
    }
    else {
      local_38 = 0;
      local_48 = *(undefined8 *)data;
      uStack_40 = *(undefined8 *)(data + 8);
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_108 = "rf_load_model_animations_from_iqm";
      uVar48 = 0x865f;
      local_100 = 0x865f;
      rf_log_impl(8,0x17d9eb,(char *)0x5);
    }
    uVar44 = 0;
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_model_animations_from_iqm";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = uVar48;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 5;
    local_370 = (rf_model_animation *)0x0;
  }
LAB_0014283f:
  rVar57.anims = local_370;
  rVar57.size = uVar44;
  return rVar57;
}

Assistant:

RF_API rf_model_animation_array rf_load_model_animations_from_iqm(const unsigned char* data, int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    if (!data || !data_size) return (rf_model_animation_array) {0};

    #define RF_IQM_MAGIC "INTERQUAKEMODEL" // IQM file magic number
    #define RF_IQM_VERSION 2 // only IQM version 2 supported

    typedef struct rf_iqm_header rf_iqm_header;
    struct rf_iqm_header
    {
        char magic[16];
        unsigned int version;
        unsigned int filesize;
        unsigned int flags;
        unsigned int num_text, ofs_text;
        unsigned int num_meshes, ofs_meshes;
        unsigned int num_vertexarrays, num_vertexes, ofs_vertexarrays;
        unsigned int num_triangles, ofs_triangles, ofs_adjacency;
        unsigned int num_joints, ofs_joints;
        unsigned int num_poses, ofs_poses;
        unsigned int num_anims, ofs_anims;
        unsigned int num_frames, num_framechannels, ofs_frames, ofs_bounds;
        unsigned int num_comment, ofs_comment;
        unsigned int num_extensions, ofs_extensions;
    };

    typedef struct rf_iqm_pose rf_iqm_pose;
    struct rf_iqm_pose
    {
        int parent;
        unsigned int mask;
        float channeloffset[10];
        float channelscale[10];
    };

    typedef struct rf_iqm_anim rf_iqm_anim;
    struct rf_iqm_anim
    {
        unsigned int name;
        unsigned int first_frame, num_frames;
        float framerate;
        unsigned int flags;
    };

    rf_iqm_header iqm;

    // Read IQM header
    memcpy(&iqm, data, sizeof(rf_iqm_header));

    if (strncmp(iqm.magic, RF_IQM_MAGIC, sizeof(RF_IQM_MAGIC)))
    {
        char temp_str[sizeof(RF_IQM_MAGIC) + 1] = {0};
        memcpy(temp_str, iqm.magic, sizeof(RF_IQM_MAGIC));
        RF_LOG_ERROR(RF_BAD_FORMAT, "Magic Number \"%s\"does not match.", temp_str);

        return (rf_model_animation_array){0};
    }

    if (iqm.version != RF_IQM_VERSION)
    {
        RF_LOG_ERROR(RF_BAD_FORMAT, "IQM version %i is incorrect.", iqm.version);

        return (rf_model_animation_array){0};
    }

    rf_model_animation_array result = {
        .size = iqm.num_anims,
    };

    // Get bones data
    rf_iqm_pose* poses = (rf_iqm_pose*) RF_ALLOC(temp_allocator, iqm.num_poses * sizeof(rf_iqm_pose));
    memcpy(poses, data + iqm.ofs_poses, iqm.num_poses * sizeof(rf_iqm_pose));

    // Get animations data
    rf_iqm_anim* anim = (rf_iqm_anim*) RF_ALLOC(temp_allocator, iqm.num_anims * sizeof(rf_iqm_anim));
    memcpy(anim, data + iqm.ofs_anims, iqm.num_anims * sizeof(rf_iqm_anim));

    rf_model_animation* animations = (rf_model_animation*) RF_ALLOC(allocator, iqm.num_anims * sizeof(rf_model_animation));

    result.anims       = animations;
    result.size = iqm.num_anims;

    // frameposes
    unsigned short* framedata = (unsigned short*) RF_ALLOC(temp_allocator, iqm.num_frames * iqm.num_framechannels * sizeof(unsigned short));
    memcpy(framedata, data + iqm.ofs_frames, iqm.num_frames*iqm.num_framechannels * sizeof(unsigned short));

    for (rf_int a = 0; a < iqm.num_anims; a++)
    {
        animations[a].frame_count = anim[a].num_frames;
        animations[a].bone_count  = iqm.num_poses;
        animations[a].bones       = (rf_bone_info*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_bone_info));
        animations[a].frame_poses = (rf_transform**) RF_ALLOC(allocator, anim[a].num_frames * sizeof(rf_transform*));
        //animations[a].framerate = anim.framerate;     // TODO: Use framerate?

        for (rf_int j = 0; j < iqm.num_poses; j++)
        {
            strcpy(animations[a].bones[j].name, "ANIMJOINTNAME");
            animations[a].bones[j].parent = poses[j].parent;
        }

        for (rf_int j = 0; j < anim[a].num_frames; j++)
        {
            animations[a].frame_poses[j] = (rf_transform*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_transform));
        }

        int dcounter = anim[a].first_frame*iqm.num_framechannels;

        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < iqm.num_poses; i++)
            {
                animations[a].frame_poses[frame][i].translation.x = poses[i].channeloffset[0];

                if (poses[i].mask & 0x01)
                {
                    animations[a].frame_poses[frame][i].translation.x += framedata[dcounter]*poses[i].channelscale[0];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.y = poses[i].channeloffset[1];

                if (poses[i].mask & 0x02)
                {
                    animations[a].frame_poses[frame][i].translation.y += framedata[dcounter]*poses[i].channelscale[1];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.z = poses[i].channeloffset[2];

                if (poses[i].mask & 0x04)
                {
                    animations[a].frame_poses[frame][i].translation.z += framedata[dcounter]*poses[i].channelscale[2];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.x = poses[i].channeloffset[3];

                if (poses[i].mask & 0x08)
                {
                    animations[a].frame_poses[frame][i].rotation.x += framedata[dcounter]*poses[i].channelscale[3];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.y = poses[i].channeloffset[4];

                if (poses[i].mask & 0x10)
                {
                    animations[a].frame_poses[frame][i].rotation.y += framedata[dcounter]*poses[i].channelscale[4];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.z = poses[i].channeloffset[5];

                if (poses[i].mask & 0x20)
                {
                    animations[a].frame_poses[frame][i].rotation.z += framedata[dcounter]*poses[i].channelscale[5];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.w = poses[i].channeloffset[6];

                if (poses[i].mask & 0x40)
                {
                    animations[a].frame_poses[frame][i].rotation.w += framedata[dcounter]*poses[i].channelscale[6];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.x = poses[i].channeloffset[7];

                if (poses[i].mask & 0x80)
                {
                    animations[a].frame_poses[frame][i].scale.x += framedata[dcounter]*poses[i].channelscale[7];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.y = poses[i].channeloffset[8];

                if (poses[i].mask & 0x100)
                {
                    animations[a].frame_poses[frame][i].scale.y += framedata[dcounter]*poses[i].channelscale[8];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.z = poses[i].channeloffset[9];

                if (poses[i].mask & 0x200)
                {
                    animations[a].frame_poses[frame][i].scale.z += framedata[dcounter]*poses[i].channelscale[9];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation = rf_quaternion_normalize(animations[a].frame_poses[frame][i].rotation);
            }
        }

        // Build frameposes
        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < animations[a].bone_count; i++)
            {
                if (animations[a].bones[i].parent >= 0)
                {
                    animations[a].frame_poses[frame][i].rotation    = rf_quaternion_mul(animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation, animations[a].frame_poses[frame][i].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_rotate_by_quaternion(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_add(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].translation);
                    animations[a].frame_poses[frame][i].scale       = rf_vec3_mul_v(animations[a].frame_poses[frame][i].scale, animations[a].frame_poses[frame][animations[a].bones[i].parent].scale);
                }
            }
        }
    }

    RF_FREE(temp_allocator, framedata);
    RF_FREE(temp_allocator, poses);
    RF_FREE(temp_allocator, anim);

    return result;
}